

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall MidiPlayerDialog::startPlayingFiles(MidiPlayerDialog *this,QStringList *fileList)

{
  QListWidget *this_00;
  QString fileName;
  QForeachContainer<QList<QString>_> _container_292;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QForeachContainer<QList<QString>_> local_70;
  QArrayDataPointer<QString> local_40;
  
  QListWidget::clear();
  QtPrivate::QForeachContainer<QList<QString>_>::QForeachContainer(&local_70,fileList);
  for (; local_70.i.i != local_70.e.i; local_70.i.i = local_70.i.i + 1) {
    local_a0.d = ((local_70.i.i)->d).d;
    local_a0.ptr = ((local_70.i.i)->d).ptr;
    local_a0.size = ((local_70.i.i)->d).size;
    if (local_a0.d == (Data *)0x0) {
      local_88.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_88.d = local_a0.d;
    }
    this_00 = *(QListWidget **)(this->ui + 0x18);
    if (local_88.d != (Data *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88.ptr = local_a0.ptr;
    local_88.size = local_a0.size;
    Master::parseMidiListFromPathName((QStringList *)&local_40,(QString *)&local_88);
    QListWidget::addItems(this_00,(QStringList *)&local_40);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_70);
  updateCurrentItem(this);
  on_playButton_clicked(this);
  return;
}

Assistant:

void MidiPlayerDialog::startPlayingFiles(const QStringList &fileList) {
	ui->playList->clear();
	foreach (QString fileName, fileList) {
		ui->playList->addItems(Master::parseMidiListFromPathName(fileName));
	}
	updateCurrentItem();
	on_playButton_clicked();
}